

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

QStringList * QFontDatabase::families(WritingSystem writingSystem)

{
  QtFontFamily *pQVar1;
  bool bVar2;
  QFontDatabasePrivate *pQVar3;
  uint in_ESI;
  QMutexLocker<QRecursiveMutex> *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView s;
  int j;
  QtFontFamily *f;
  int i;
  QFontDatabasePrivate *d;
  QStringList *flist;
  QString foundry;
  QString str;
  QMutexLocker<QRecursiveMutex> locker;
  QtFontFamily *in_stack_ffffffffffffff58;
  QMutexLocker<QRecursiveMutex> *str_00;
  int local_7c;
  int local_70;
  QChar local_4a;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  str_00 = in_RDI;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
              *)in_stack_ffffffffffffff58);
  QMutexLocker<QRecursiveMutex>::QMutexLocker(in_RDI,(QRecursiveMutex *)in_stack_ffffffffffffff58);
  pQVar3 = QFontDatabasePrivate::ensureFontDatabase();
  str_00->m_mutex = (QRecursiveMutex *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&str_00->m_isLocked = &DAT_aaaaaaaaaaaaaaaa;
  str_00[1].m_mutex = (QRecursiveMutex *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x741a95);
  for (local_70 = 0; local_70 < pQVar3->count; local_70 = local_70 + 1) {
    pQVar1 = pQVar3->families[local_70];
    if ((((undefined1  [112])((undefined1  [112])*pQVar1 & (undefined1  [112])0x1) ==
          (undefined1  [112])0x0) || (pQVar1->count != 0)) &&
       ((in_ESI == 0 ||
        ((bVar2 = QtFontFamily::ensurePopulated(in_stack_ffffffffffffff58), bVar2 &&
         (pQVar1->writingSystems[in_ESI] == '\x01')))))) {
      if (((undefined1  [112])((undefined1  [112])*pQVar1 & (undefined1  [112])0x1) ==
           (undefined1  [112])0x0) || (pQVar1->count == 1)) {
        QList<QString>::append((QList<QString> *)in_RDI,(parameter_type)in_stack_ffffffffffffff58);
      }
      else {
        for (local_7c = 0; local_7c < pQVar1->count; local_7c = local_7c + 1) {
          local_30 = &DAT_aaaaaaaaaaaaaaaa;
          local_28 = &DAT_aaaaaaaaaaaaaaaa;
          local_20 = &DAT_aaaaaaaaaaaaaaaa;
          QString::QString((QString *)in_RDI,(QString *)in_stack_ffffffffffffff58);
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          local_40 = &DAT_aaaaaaaaaaaaaaaa;
          local_38 = &DAT_aaaaaaaaaaaaaaaa;
          QString::QString((QString *)in_RDI,(QString *)in_stack_ffffffffffffff58);
          bVar2 = QString::isEmpty((QString *)0x741be7);
          if (!bVar2) {
            s = Qt::Literals::StringLiterals::operator____L1((char *)str_00,(size_t)in_RDI);
            QString::operator+=((QString *)in_stack_ffffffffffffff58,s);
            QString::operator+=((QString *)in_RDI,(QString *)in_stack_ffffffffffffff58);
            QChar::QChar<char16_t,_true>(&local_4a,L']');
            QString::operator+=((QString *)in_RDI,(QChar)(char16_t)((ulong)str_00 >> 0x30));
          }
          QList<QString>::append((QList<QString> *)in_RDI,(parameter_type)in_stack_ffffffffffffff58)
          ;
          QString::~QString((QString *)0x741c60);
          QString::~QString((QString *)0x741c6a);
        }
      }
    }
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QStringList *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QFontDatabase::families(WritingSystem writingSystem)
{
    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QStringList flist;
    for (int i = 0; i < d->count; i++) {
        QtFontFamily *f = d->families[i];
        if (f->populated && f->count == 0)
            continue;
        if (writingSystem != Any) {
            if (!f->ensurePopulated())
                continue;
            if (f->writingSystems[writingSystem] != QtFontFamily::Supported)
                continue;
        }
        if (!f->populated || f->count == 1) {
            flist.append(f->name);
        } else {
            for (int j = 0; j < f->count; j++) {
                QString str = f->name;
                QString foundry = f->foundries[j]->name;
                if (!foundry.isEmpty()) {
                    str += " ["_L1;
                    str += foundry;
                    str += u']';
                }
                flist.append(str);
            }
        }
    }
    return flist;
}